

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::AbortedRead::pumpTo
          (AbortedRead *this,AsyncOutputStream *output,uint64_t amount)

{
  char *pcVar1;
  size_t sVar2;
  char (*in_RCX) [28];
  String local_1c8;
  Exception local_1a8;
  
  kj::_::Debug::makeDescription<char_const(&)[28]>
            (&local_1c8,(Debug *)0x50c726,"abortRead() has been called",in_RCX);
  Exception::Exception
            (&local_1a8,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x594,&local_1c8);
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
            ((PromiseDisposer *)this,&local_1a8);
  Exception::~Exception(&local_1a8);
  sVar2 = local_1c8.content.size_;
  pcVar1 = local_1c8.content.ptr;
  if (local_1c8.content.ptr != (char *)0x0) {
    local_1c8.content.ptr = (char *)0x0;
    local_1c8.content.size_ = 0;
    (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
              (local_1c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> pumpTo(AsyncOutputStream& output, uint64_t amount) override {
      return KJ_EXCEPTION(DISCONNECTED, "abortRead() has been called");
    }